

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O0

void cfd::capi::CfdCapiManager::FreeAllList
               (vector<cfd::capi::CfdCapiHandleData_*,_std::allocator<cfd::capi::CfdCapiHandleData_*>_>
                *list)

{
  bool bVar1;
  iterator __lhs;
  reference ppCVar2;
  long in_RDI;
  CfdCapiHandleData *handle;
  iterator __end3;
  iterator __begin3;
  vector<cfd::capi::CfdCapiHandleData_*,_std::allocator<cfd::capi::CfdCapiHandleData_*>_> *__range3;
  CfdCapiHandleData *in_stack_ffffffffffffffd8;
  __normal_iterator<cfd::capi::CfdCapiHandleData_**,_std::vector<cfd::capi::CfdCapiHandleData_*,_std::allocator<cfd::capi::CfdCapiHandleData_*>_>_>
  local_18;
  vector<cfd::capi::CfdCapiHandleData_*,_std::allocator<cfd::capi::CfdCapiHandleData_*>_>
  *in_stack_fffffffffffffff0;
  
  if (in_RDI != 0) {
    bVar1 = std::
            vector<cfd::capi::CfdCapiHandleData_*,_std::allocator<cfd::capi::CfdCapiHandleData_*>_>
            ::empty(in_stack_fffffffffffffff0);
    if (!bVar1) {
      local_18._M_current =
           (CfdCapiHandleData **)
           std::
           vector<cfd::capi::CfdCapiHandleData_*,_std::allocator<cfd::capi::CfdCapiHandleData_*>_>::
           begin((vector<cfd::capi::CfdCapiHandleData_*,_std::allocator<cfd::capi::CfdCapiHandleData_*>_>
                  *)in_stack_ffffffffffffffd8);
      __lhs = std::
              vector<cfd::capi::CfdCapiHandleData_*,_std::allocator<cfd::capi::CfdCapiHandleData_*>_>
              ::end((vector<cfd::capi::CfdCapiHandleData_*,_std::allocator<cfd::capi::CfdCapiHandleData_*>_>
                     *)in_stack_ffffffffffffffd8);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<cfd::capi::CfdCapiHandleData_**,_std::vector<cfd::capi::CfdCapiHandleData_*,_std::allocator<cfd::capi::CfdCapiHandleData_*>_>_>
                            *)__lhs._M_current,
                           (__normal_iterator<cfd::capi::CfdCapiHandleData_**,_std::vector<cfd::capi::CfdCapiHandleData_*,_std::allocator<cfd::capi::CfdCapiHandleData_*>_>_>
                            *)in_stack_ffffffffffffffd8);
        if (!bVar1) break;
        ppCVar2 = __gnu_cxx::
                  __normal_iterator<cfd::capi::CfdCapiHandleData_**,_std::vector<cfd::capi::CfdCapiHandleData_*,_std::allocator<cfd::capi::CfdCapiHandleData_*>_>_>
                  ::operator*(&local_18);
        in_stack_ffffffffffffffd8 = *ppCVar2;
        free(in_stack_ffffffffffffffd8);
        __gnu_cxx::
        __normal_iterator<cfd::capi::CfdCapiHandleData_**,_std::vector<cfd::capi::CfdCapiHandleData_*,_std::allocator<cfd::capi::CfdCapiHandleData_*>_>_>
        ::operator++(&local_18);
      }
      std::vector<cfd::capi::CfdCapiHandleData_*,_std::allocator<cfd::capi::CfdCapiHandleData_*>_>::
      clear((vector<cfd::capi::CfdCapiHandleData_*,_std::allocator<cfd::capi::CfdCapiHandleData_*>_>
             *)0x5761dc);
    }
  }
  return;
}

Assistant:

void CfdCapiManager::FreeAllList(std::vector<CfdCapiHandleData*>* list) {
  if ((list != nullptr) && (!list->empty())) {
    for (CfdCapiHandleData* handle : *list) {
      ::free(handle);
    }
    list->clear();
  }
}